

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int test_memcpy(void)

{
  int iVar1;
  ptrdiff_t local_28;
  ptrdiff_t sz;
  char *pcStack_18;
  int i;
  char *d;
  int len;
  
  _plan(0xb,true);
  _space(_stdout);
  printf("# *** %s ***\n","test_memcpy");
  d._4_4_ = 0x1b;
  for (sz._4_4_ = 0; sz._4_4_ < 0x1b; sz._4_4_ = sz._4_4_ + 1) {
    str[sz._4_4_] = (char)(sz._4_4_ % 0x1a) + 'a';
  }
  pcStack_18 = mp_memcpy(data,str,0x1b);
  _ok((uint)((long)pcStack_18 - (long)data == (long)(int)d._4_4_),"d - data == len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x282,
      "len of mp_memcpy()");
  iVar1 = memcmp(data,str,(long)(int)d._4_4_);
  _ok((uint)(iVar1 == 0),"memcmp(data, str, len) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x283,
      "payload of mp_memcpy()");
  local_28 = 0;
  pcStack_18 = mp_memcpy_safe((char *)0x0,&local_28,str,d._4_4_);
  _ok((uint)(-local_28 == (long)(int)d._4_4_),"-sz == len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x287,
      "size after mp_memcpy_safe(NULL, &sz)");
  _ok((uint)(pcStack_18 == (char *)0x0),"d == NULL",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x288,
      "mp_memcpy_safe(NULL, &sz)");
  local_28 = (ptrdiff_t)(int)d._4_4_;
  pcStack_18 = mp_memcpy_safe(data,&local_28,str,d._4_4_);
  _ok((uint)(local_28 == 0),"sz == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x28c,
      "size after mp_memcpy_safe(buf, &sz)");
  _ok((uint)((long)pcStack_18 - (long)data == (long)(int)d._4_4_),"d - data == len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x28d,
      "len of mp_memcpy_safe(buf, &sz)");
  iVar1 = memcmp(data,str,(long)(int)d._4_4_);
  _ok((uint)(iVar1 == 0),"memcmp(data, str, len) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x28e,
      "mp_memcpy_safe(buf, &sz)");
  local_28 = (ptrdiff_t)(int)(d._4_4_ - 1);
  pcStack_18 = mp_memcpy_safe(data,&local_28,str,d._4_4_);
  _ok((uint)(local_28 == -1),"sz == -1",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x292,
      "size after mp_memcpy_safe(buf, &sz) overflow");
  _ok((uint)(pcStack_18 == data),"d == data",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x293,
      "mp_memcpy_safe(buf, &sz) overflow");
  pcStack_18 = mp_memcpy_safe(data,(ptrdiff_t *)0x0,str,d._4_4_);
  _ok((uint)((long)pcStack_18 - (long)data == (long)(int)d._4_4_),"d - data == len",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x296,
      "len of (buf, NULL)");
  iVar1 = memcmp(data,str,(long)(int)d._4_4_);
  _ok((uint)(iVar1 == 0),"memcmp(data, str, len) == 0",
      "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",0x297,
      "mp_memcpy_safe(buf, NULL)");
  _space(_stdout);
  printf("# *** %s: done ***\n","test_memcpy");
  iVar1 = check_plan();
  return iVar1;
}

Assistant:

static int
test_memcpy()
{
	plan(11);
	header();

	int len = 27;
	char *d;

	for (int i = 0; i < len; i++)
		str[i] = 'a' + i % 26;

	d = mp_memcpy(data, str, len);
	is(d - data, len, "len of mp_memcpy()");
	is(memcmp(data, str, len), 0, "payload of mp_memcpy()");

	ptrdiff_t sz = 0;
	d = mp_memcpy_safe(NULL, &sz, str, len);
	is(-sz, len, "size after mp_memcpy_safe(NULL, &sz)");
	is(d, NULL, "mp_memcpy_safe(NULL, &sz)");

	sz = len;
	d = mp_memcpy_safe(data, &sz, str, len);
	is(sz, 0, "size after mp_memcpy_safe(buf, &sz)");
	is(d - data, len, "len of mp_memcpy_safe(buf, &sz)");
	is(memcmp(data, str, len), 0, "mp_memcpy_safe(buf, &sz)");

	sz = len - 1;
	d = mp_memcpy_safe(data, &sz, str, len);
	is(sz, -1, "size after mp_memcpy_safe(buf, &sz) overflow");
	is(d, data, "mp_memcpy_safe(buf, &sz) overflow");

	d = mp_memcpy_safe(data, NULL, str, len);
	is(d - data, len, "len of (buf, NULL)");
	is(memcmp(data, str, len), 0, "mp_memcpy_safe(buf, NULL)");

	footer();
	return check_plan();
}